

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmTarget.cxx
# Opt level: O2

void __thiscall cmTarget::SetMakefile(cmTarget *this,cmMakefile *mf)

{
  cmMakefile *pcVar1;
  cmTargetInternals *pcVar2;
  bool bVar3;
  int iVar4;
  TargetType TVar5;
  char *pcVar6;
  pointer s;
  char **p;
  undefined **ppuVar7;
  cmStringRange cVar8;
  cmBacktraceRange cVar9;
  string configUpper;
  string property;
  allocator local_7b;
  allocator local_7a;
  allocator local_79;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  configNames;
  string local_50;
  
  this->Makefile = mf;
  std::__cxx11::string::string((string *)&configUpper,"WIN32",&local_7b);
  bVar3 = cmMakefile::IsOn(mf,&configUpper);
  if (bVar3) {
    this->DLLPlatform = true;
  }
  else {
    pcVar1 = this->Makefile;
    std::__cxx11::string::string((string *)&property,"CYGWIN",&local_79);
    bVar3 = cmMakefile::IsOn(pcVar1,&property);
    if (bVar3) {
      this->DLLPlatform = true;
    }
    else {
      pcVar1 = this->Makefile;
      std::__cxx11::string::string((string *)&configNames,"MINGW",&local_7a);
      bVar3 = cmMakefile::IsOn(pcVar1,(string *)&configNames);
      this->DLLPlatform = bVar3;
      std::__cxx11::string::~string((string *)&configNames);
    }
    std::__cxx11::string::~string((string *)&property);
  }
  std::__cxx11::string::~string((string *)&configUpper);
  pcVar1 = this->Makefile;
  std::__cxx11::string::string((string *)&configUpper,"CMAKE_SYSTEM_NAME",(allocator *)&property);
  pcVar6 = cmMakefile::GetSafeDefinition(pcVar1,&configUpper);
  iVar4 = strcmp(pcVar6,"Android");
  this->IsAndroid = iVar4 == 0;
  std::__cxx11::string::~string((string *)&configUpper);
  if ((this->TargetTypeValue | SHARED_LIBRARY) != INTERFACE_LIBRARY) {
    std::__cxx11::string::string((string *)&configUpper,"ANDROID_API",(allocator *)&property);
    SetPropertyDefault(this,&configUpper,(char *)0x0);
    std::__cxx11::string::~string((string *)&configUpper);
    std::__cxx11::string::string((string *)&configUpper,"ANDROID_API_MIN",(allocator *)&property);
    SetPropertyDefault(this,&configUpper,(char *)0x0);
    std::__cxx11::string::~string((string *)&configUpper);
    std::__cxx11::string::string((string *)&configUpper,"ANDROID_ARCH",(allocator *)&property);
    SetPropertyDefault(this,&configUpper,(char *)0x0);
    std::__cxx11::string::~string((string *)&configUpper);
    std::__cxx11::string::string((string *)&configUpper,"ANDROID_STL_TYPE",(allocator *)&property);
    SetPropertyDefault(this,&configUpper,(char *)0x0);
    std::__cxx11::string::~string((string *)&configUpper);
    std::__cxx11::string::string
              ((string *)&configUpper,"ANDROID_SKIP_ANT_STEP",(allocator *)&property);
    SetPropertyDefault(this,&configUpper,(char *)0x0);
    std::__cxx11::string::~string((string *)&configUpper);
    std::__cxx11::string::string
              ((string *)&configUpper,"ANDROID_PROCESS_MAX",(allocator *)&property);
    SetPropertyDefault(this,&configUpper,(char *)0x0);
    std::__cxx11::string::~string((string *)&configUpper);
    std::__cxx11::string::string((string *)&configUpper,"ANDROID_PROGUARD",(allocator *)&property);
    SetPropertyDefault(this,&configUpper,(char *)0x0);
    std::__cxx11::string::~string((string *)&configUpper);
    std::__cxx11::string::string
              ((string *)&configUpper,"ANDROID_PROGUARD_CONFIG_PATH",(allocator *)&property);
    SetPropertyDefault(this,&configUpper,(char *)0x0);
    std::__cxx11::string::~string((string *)&configUpper);
    std::__cxx11::string::string
              ((string *)&configUpper,"ANDROID_SECURE_PROPS_PATH",(allocator *)&property);
    SetPropertyDefault(this,&configUpper,(char *)0x0);
    std::__cxx11::string::~string((string *)&configUpper);
    std::__cxx11::string::string
              ((string *)&configUpper,"ANDROID_NATIVE_LIB_DIRECTORIES",(allocator *)&property);
    SetPropertyDefault(this,&configUpper,(char *)0x0);
    std::__cxx11::string::~string((string *)&configUpper);
    std::__cxx11::string::string
              ((string *)&configUpper,"ANDROID_NATIVE_LIB_DEPENDENCIES",(allocator *)&property);
    SetPropertyDefault(this,&configUpper,(char *)0x0);
    std::__cxx11::string::~string((string *)&configUpper);
    std::__cxx11::string::string
              ((string *)&configUpper,"ANDROID_JAVA_SOURCE_DIR",(allocator *)&property);
    SetPropertyDefault(this,&configUpper,(char *)0x0);
    std::__cxx11::string::~string((string *)&configUpper);
    std::__cxx11::string::string
              ((string *)&configUpper,"ANDROID_JAR_DIRECTORIES",(allocator *)&property);
    SetPropertyDefault(this,&configUpper,(char *)0x0);
    std::__cxx11::string::~string((string *)&configUpper);
    std::__cxx11::string::string
              ((string *)&configUpper,"ANDROID_JAR_DEPENDENCIES",(allocator *)&property);
    SetPropertyDefault(this,&configUpper,(char *)0x0);
    std::__cxx11::string::~string((string *)&configUpper);
    std::__cxx11::string::string
              ((string *)&configUpper,"ANDROID_ASSETS_DIRECTORIES",(allocator *)&property);
    SetPropertyDefault(this,&configUpper,(char *)0x0);
    std::__cxx11::string::~string((string *)&configUpper);
    std::__cxx11::string::string
              ((string *)&configUpper,"ANDROID_ANT_ADDITIONAL_OPTIONS",(allocator *)&property);
    SetPropertyDefault(this,&configUpper,(char *)0x0);
    std::__cxx11::string::~string((string *)&configUpper);
    std::__cxx11::string::string((string *)&configUpper,"INSTALL_NAME_DIR",(allocator *)&property);
    SetPropertyDefault(this,&configUpper,(char *)0x0);
    std::__cxx11::string::~string((string *)&configUpper);
    std::__cxx11::string::string((string *)&configUpper,"INSTALL_RPATH",(allocator *)&property);
    SetPropertyDefault(this,&configUpper,"");
    std::__cxx11::string::~string((string *)&configUpper);
    std::__cxx11::string::string
              ((string *)&configUpper,"INSTALL_RPATH_USE_LINK_PATH",(allocator *)&property);
    SetPropertyDefault(this,&configUpper,"OFF");
    std::__cxx11::string::~string((string *)&configUpper);
    std::__cxx11::string::string((string *)&configUpper,"SKIP_BUILD_RPATH",(allocator *)&property);
    SetPropertyDefault(this,&configUpper,"OFF");
    std::__cxx11::string::~string((string *)&configUpper);
    std::__cxx11::string::string
              ((string *)&configUpper,"BUILD_WITH_INSTALL_RPATH",(allocator *)&property);
    SetPropertyDefault(this,&configUpper,"OFF");
    std::__cxx11::string::~string((string *)&configUpper);
    std::__cxx11::string::string
              ((string *)&configUpper,"ARCHIVE_OUTPUT_DIRECTORY",(allocator *)&property);
    SetPropertyDefault(this,&configUpper,(char *)0x0);
    std::__cxx11::string::~string((string *)&configUpper);
    std::__cxx11::string::string
              ((string *)&configUpper,"LIBRARY_OUTPUT_DIRECTORY",(allocator *)&property);
    SetPropertyDefault(this,&configUpper,(char *)0x0);
    std::__cxx11::string::~string((string *)&configUpper);
    std::__cxx11::string::string
              ((string *)&configUpper,"RUNTIME_OUTPUT_DIRECTORY",(allocator *)&property);
    SetPropertyDefault(this,&configUpper,(char *)0x0);
    std::__cxx11::string::~string((string *)&configUpper);
    std::__cxx11::string::string
              ((string *)&configUpper,"PDB_OUTPUT_DIRECTORY",(allocator *)&property);
    SetPropertyDefault(this,&configUpper,(char *)0x0);
    std::__cxx11::string::~string((string *)&configUpper);
    std::__cxx11::string::string
              ((string *)&configUpper,"COMPILE_PDB_OUTPUT_DIRECTORY",(allocator *)&property);
    SetPropertyDefault(this,&configUpper,(char *)0x0);
    std::__cxx11::string::~string((string *)&configUpper);
    std::__cxx11::string::string((string *)&configUpper,"Fortran_FORMAT",(allocator *)&property);
    SetPropertyDefault(this,&configUpper,(char *)0x0);
    std::__cxx11::string::~string((string *)&configUpper);
    std::__cxx11::string::string
              ((string *)&configUpper,"Fortran_MODULE_DIRECTORY",(allocator *)&property);
    SetPropertyDefault(this,&configUpper,(char *)0x0);
    std::__cxx11::string::~string((string *)&configUpper);
    std::__cxx11::string::string((string *)&configUpper,"GNUtoMS",(allocator *)&property);
    SetPropertyDefault(this,&configUpper,(char *)0x0);
    std::__cxx11::string::~string((string *)&configUpper);
    std::__cxx11::string::string((string *)&configUpper,"OSX_ARCHITECTURES",(allocator *)&property);
    SetPropertyDefault(this,&configUpper,(char *)0x0);
    std::__cxx11::string::~string((string *)&configUpper);
    std::__cxx11::string::string
              ((string *)&configUpper,"IOS_INSTALL_COMBINED",(allocator *)&property);
    SetPropertyDefault(this,&configUpper,(char *)0x0);
    std::__cxx11::string::~string((string *)&configUpper);
    std::__cxx11::string::string((string *)&configUpper,"AUTOMOC",(allocator *)&property);
    SetPropertyDefault(this,&configUpper,(char *)0x0);
    std::__cxx11::string::~string((string *)&configUpper);
    std::__cxx11::string::string((string *)&configUpper,"AUTOUIC",(allocator *)&property);
    SetPropertyDefault(this,&configUpper,(char *)0x0);
    std::__cxx11::string::~string((string *)&configUpper);
    std::__cxx11::string::string((string *)&configUpper,"AUTORCC",(allocator *)&property);
    SetPropertyDefault(this,&configUpper,(char *)0x0);
    std::__cxx11::string::~string((string *)&configUpper);
    std::__cxx11::string::string
              ((string *)&configUpper,"AUTOMOC_MOC_OPTIONS",(allocator *)&property);
    SetPropertyDefault(this,&configUpper,(char *)0x0);
    std::__cxx11::string::~string((string *)&configUpper);
    std::__cxx11::string::string((string *)&configUpper,"AUTOUIC_OPTIONS",(allocator *)&property);
    SetPropertyDefault(this,&configUpper,(char *)0x0);
    std::__cxx11::string::~string((string *)&configUpper);
    std::__cxx11::string::string((string *)&configUpper,"AUTORCC_OPTIONS",(allocator *)&property);
    SetPropertyDefault(this,&configUpper,(char *)0x0);
    std::__cxx11::string::~string((string *)&configUpper);
    std::__cxx11::string::string
              ((string *)&configUpper,"LINK_DEPENDS_NO_SHARED",(allocator *)&property);
    SetPropertyDefault(this,&configUpper,(char *)0x0);
    std::__cxx11::string::~string((string *)&configUpper);
    std::__cxx11::string::string
              ((string *)&configUpper,"LINK_INTERFACE_LIBRARIES",(allocator *)&property);
    SetPropertyDefault(this,&configUpper,(char *)0x0);
    std::__cxx11::string::~string((string *)&configUpper);
    std::__cxx11::string::string((string *)&configUpper,"WIN32_EXECUTABLE",(allocator *)&property);
    SetPropertyDefault(this,&configUpper,(char *)0x0);
    std::__cxx11::string::~string((string *)&configUpper);
    std::__cxx11::string::string((string *)&configUpper,"MACOSX_BUNDLE",(allocator *)&property);
    SetPropertyDefault(this,&configUpper,(char *)0x0);
    std::__cxx11::string::~string((string *)&configUpper);
    std::__cxx11::string::string((string *)&configUpper,"MACOSX_RPATH",(allocator *)&property);
    SetPropertyDefault(this,&configUpper,(char *)0x0);
    std::__cxx11::string::~string((string *)&configUpper);
    std::__cxx11::string::string
              ((string *)&configUpper,"NO_SYSTEM_FROM_IMPORTED",(allocator *)&property);
    SetPropertyDefault(this,&configUpper,(char *)0x0);
    std::__cxx11::string::~string((string *)&configUpper);
    std::__cxx11::string::string
              ((string *)&configUpper,"C_COMPILER_LAUNCHER",(allocator *)&property);
    SetPropertyDefault(this,&configUpper,(char *)0x0);
    std::__cxx11::string::~string((string *)&configUpper);
    std::__cxx11::string::string
              ((string *)&configUpper,"C_INCLUDE_WHAT_YOU_USE",(allocator *)&property);
    SetPropertyDefault(this,&configUpper,(char *)0x0);
    std::__cxx11::string::~string((string *)&configUpper);
    std::__cxx11::string::string((string *)&configUpper,"C_STANDARD",(allocator *)&property);
    SetPropertyDefault(this,&configUpper,(char *)0x0);
    std::__cxx11::string::~string((string *)&configUpper);
    std::__cxx11::string::string
              ((string *)&configUpper,"C_STANDARD_REQUIRED",(allocator *)&property);
    SetPropertyDefault(this,&configUpper,(char *)0x0);
    std::__cxx11::string::~string((string *)&configUpper);
    std::__cxx11::string::string((string *)&configUpper,"C_EXTENSIONS",(allocator *)&property);
    SetPropertyDefault(this,&configUpper,(char *)0x0);
    std::__cxx11::string::~string((string *)&configUpper);
    std::__cxx11::string::string
              ((string *)&configUpper,"CXX_COMPILER_LAUNCHER",(allocator *)&property);
    SetPropertyDefault(this,&configUpper,(char *)0x0);
    std::__cxx11::string::~string((string *)&configUpper);
    std::__cxx11::string::string
              ((string *)&configUpper,"CXX_INCLUDE_WHAT_YOU_USE",(allocator *)&property);
    SetPropertyDefault(this,&configUpper,(char *)0x0);
    std::__cxx11::string::~string((string *)&configUpper);
    std::__cxx11::string::string((string *)&configUpper,"CXX_STANDARD",(allocator *)&property);
    SetPropertyDefault(this,&configUpper,(char *)0x0);
    std::__cxx11::string::~string((string *)&configUpper);
    std::__cxx11::string::string
              ((string *)&configUpper,"CXX_STANDARD_REQUIRED",(allocator *)&property);
    SetPropertyDefault(this,&configUpper,(char *)0x0);
    std::__cxx11::string::~string((string *)&configUpper);
    std::__cxx11::string::string((string *)&configUpper,"CXX_EXTENSIONS",(allocator *)&property);
    SetPropertyDefault(this,&configUpper,(char *)0x0);
    std::__cxx11::string::~string((string *)&configUpper);
    std::__cxx11::string::string
              ((string *)&configUpper,"LINK_SEARCH_START_STATIC",(allocator *)&property);
    SetPropertyDefault(this,&configUpper,(char *)0x0);
    std::__cxx11::string::~string((string *)&configUpper);
    std::__cxx11::string::string
              ((string *)&configUpper,"LINK_SEARCH_END_STATIC",(allocator *)&property);
    SetPropertyDefault(this,&configUpper,(char *)0x0);
    std::__cxx11::string::~string((string *)&configUpper);
  }
  configNames.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  configNames.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  configNames.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  cmMakefile::GetConfigurations(&local_50,mf,&configNames,true);
  std::__cxx11::string::~string((string *)&local_50);
  if (this->TargetTypeValue != UTILITY) {
    for (s = configNames.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
        s != configNames.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish; s = s + 1) {
      cmsys::SystemTools::UpperCase(&configUpper,s);
      ppuVar7 = &PTR_anon_var_dwarf_4de32b_00686700;
      while( true ) {
        pcVar6 = *ppuVar7;
        TVar5 = this->TargetTypeValue;
        if (pcVar6 == (char *)0x0) break;
        if (TVar5 == INTERFACE_LIBRARY) {
          iVar4 = strcmp(pcVar6,"MAP_IMPORTED_CONFIG_");
          if (iVar4 == 0) goto LAB_0036a2f6;
        }
        else {
LAB_0036a2f6:
          std::__cxx11::string::string((string *)&property,pcVar6,&local_7b);
          std::__cxx11::string::append((string *)&property);
          SetPropertyDefault(this,&property,(char *)0x0);
          std::__cxx11::string::~string((string *)&property);
        }
        ppuVar7 = ppuVar7 + 1;
      }
      if ((TVar5 != EXECUTABLE) && (TVar5 != INTERFACE_LIBRARY)) {
        cmsys::SystemTools::UpperCase(&property,s);
        std::__cxx11::string::append((char *)&property);
        SetPropertyDefault(this,&property,(char *)0x0);
        std::__cxx11::string::~string((string *)&property);
      }
      std::__cxx11::string::~string((string *)&configUpper);
    }
  }
  cmMakefile::GetBacktrace((cmListFileBacktrace *)&configUpper,this->Makefile);
  cmListFileBacktrace::operator=(&this->Backtrace,(cmListFileBacktrace *)&configUpper);
  cmListFileBacktrace::~cmListFileBacktrace((cmListFileBacktrace *)&configUpper);
  if (this->IsImportedTarget == false) {
    cVar8 = cmMakefile::GetIncludeDirectoriesEntries_abi_cxx11_(this->Makefile);
    cVar9 = cmMakefile::GetIncludeDirectoriesBacktraces(this->Makefile);
    pcVar2 = (this->Internal).Pointer;
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    insert<__gnu_cxx::__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,void>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)pcVar2,
               (pcVar2->IncludeDirectoriesEntries).
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               cVar8.Begin._M_current,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               cVar8.End._M_current);
    pcVar2 = (this->Internal).Pointer;
    std::vector<cmListFileBacktrace,std::allocator<cmListFileBacktrace>>::
    insert<__gnu_cxx::__normal_iterator<cmListFileBacktrace_const*,std::vector<cmListFileBacktrace,std::allocator<cmListFileBacktrace>>>,void>
              ((vector<cmListFileBacktrace,std::allocator<cmListFileBacktrace>> *)
               &pcVar2->IncludeDirectoriesBacktraces,
               (pcVar2->IncludeDirectoriesBacktraces).
               super__Vector_base<cmListFileBacktrace,_std::allocator<cmListFileBacktrace>_>._M_impl
               .super__Vector_impl_data._M_finish,(cmListFileBacktrace *)cVar9.Begin._M_current,
               (cmListFileBacktrace *)cVar9.End._M_current);
    std::
    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)&configUpper,&(this->Makefile->SystemIncludeDirectories)._M_t);
    std::
    _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
    ::_M_insert_range_unique<std::_Rb_tree_const_iterator<std::__cxx11::string>>
              ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                *)&this->SystemIncludeDirectories,
               (_Rb_tree_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                )configUpper.field_2._8_8_,
               (_Rb_tree_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                )&configUpper._M_string_length);
    cVar8 = cmMakefile::GetCompileOptionsEntries_abi_cxx11_(this->Makefile);
    cVar9 = cmMakefile::GetCompileOptionsBacktraces(this->Makefile);
    pcVar2 = (this->Internal).Pointer;
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    insert<__gnu_cxx::__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,void>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
               &pcVar2->CompileOptionsEntries,
               (pcVar2->CompileOptionsEntries).
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               cVar8.Begin._M_current,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               cVar8.End._M_current);
    pcVar2 = (this->Internal).Pointer;
    std::vector<cmListFileBacktrace,std::allocator<cmListFileBacktrace>>::
    insert<__gnu_cxx::__normal_iterator<cmListFileBacktrace_const*,std::vector<cmListFileBacktrace,std::allocator<cmListFileBacktrace>>>,void>
              ((vector<cmListFileBacktrace,std::allocator<cmListFileBacktrace>> *)
               &pcVar2->CompileOptionsBacktraces,
               (pcVar2->CompileOptionsBacktraces).
               super__Vector_base<cmListFileBacktrace,_std::allocator<cmListFileBacktrace>_>._M_impl
               .super__Vector_impl_data._M_finish,(cmListFileBacktrace *)cVar9.Begin._M_current,
               (cmListFileBacktrace *)cVar9.End._M_current);
    std::
    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&configUpper);
  }
  TVar5 = this->TargetTypeValue;
  if ((TVar5 | SHARED_LIBRARY) != INTERFACE_LIBRARY) {
    std::__cxx11::string::string
              ((string *)&configUpper,"C_VISIBILITY_PRESET",(allocator *)&property);
    SetPropertyDefault(this,&configUpper,(char *)0x0);
    std::__cxx11::string::~string((string *)&configUpper);
    std::__cxx11::string::string
              ((string *)&configUpper,"CXX_VISIBILITY_PRESET",(allocator *)&property);
    SetPropertyDefault(this,&configUpper,(char *)0x0);
    std::__cxx11::string::~string((string *)&configUpper);
    std::__cxx11::string::string
              ((string *)&configUpper,"VISIBILITY_INLINES_HIDDEN",(allocator *)&property);
    SetPropertyDefault(this,&configUpper,(char *)0x0);
    std::__cxx11::string::~string((string *)&configUpper);
    TVar5 = this->TargetTypeValue;
    if (TVar5 == EXECUTABLE) {
      std::__cxx11::string::string((string *)&configUpper,"ANDROID_GUI",(allocator *)&property);
      SetPropertyDefault(this,&configUpper,(char *)0x0);
      std::__cxx11::string::~string((string *)&configUpper);
      std::__cxx11::string::string
                ((string *)&configUpper,"CROSSCOMPILING_EMULATOR",(allocator *)&property);
      SetPropertyDefault(this,&configUpper,(char *)0x0);
      std::__cxx11::string::~string((string *)&configUpper);
      std::__cxx11::string::string((string *)&configUpper,"ENABLE_EXPORTS",(allocator *)&property);
      SetPropertyDefault(this,&configUpper,(char *)0x0);
      std::__cxx11::string::~string((string *)&configUpper);
      TVar5 = this->TargetTypeValue;
    }
  }
  if ((TVar5 & ~STATIC_LIBRARY) == SHARED_LIBRARY) {
    std::__cxx11::string::string
              ((string *)&configUpper,"POSITION_INDEPENDENT_CODE",(allocator *)&property);
    SetProperty(this,&configUpper,"True");
    std::__cxx11::string::~string((string *)&configUpper);
    TVar5 = this->TargetTypeValue;
    if (TVar5 == SHARED_LIBRARY) {
      std::__cxx11::string::string
                ((string *)&configUpper,"WINDOWS_EXPORT_ALL_SYMBOLS",(allocator *)&property);
      SetPropertyDefault(this,&configUpper,(char *)0x0);
      std::__cxx11::string::~string((string *)&configUpper);
      TVar5 = this->TargetTypeValue;
    }
  }
  if ((TVar5 | SHARED_LIBRARY) != INTERFACE_LIBRARY) {
    std::__cxx11::string::string
              ((string *)&configUpper,"POSITION_INDEPENDENT_CODE",(allocator *)&property);
    SetPropertyDefault(this,&configUpper,(char *)0x0);
    std::__cxx11::string::~string((string *)&configUpper);
  }
  cmMakefile::RecordPolicies(this->Makefile,&this->PolicyMap);
  TVar5 = this->TargetTypeValue;
  if (TVar5 == INTERFACE_LIBRARY) {
    cmPolicies::PolicyMap::Set(&this->PolicyMap,CMP0022,NEW);
    TVar5 = this->TargetTypeValue;
    if (TVar5 == INTERFACE_LIBRARY) goto LAB_0036a274;
  }
  if (TVar5 != UTILITY) {
    std::__cxx11::string::string((string *)&configUpper,"JOB_POOL_COMPILE",(allocator *)&property);
    SetPropertyDefault(this,&configUpper,(char *)0x0);
    std::__cxx11::string::~string((string *)&configUpper);
    std::__cxx11::string::string((string *)&configUpper,"JOB_POOL_LINK",(allocator *)&property);
    SetPropertyDefault(this,&configUpper,(char *)0x0);
    std::__cxx11::string::~string((string *)&configUpper);
  }
LAB_0036a274:
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&configNames);
  return;
}

Assistant:

void cmTarget::SetMakefile(cmMakefile* mf)
{
  // Set our makefile.
  this->Makefile = mf;

  // Check whether this is a DLL platform.
  this->DLLPlatform = (this->Makefile->IsOn("WIN32") ||
                       this->Makefile->IsOn("CYGWIN") ||
                       this->Makefile->IsOn("MINGW"));

  // Check whether we are targeting an Android platform.
  this->IsAndroid =
    strcmp(this->Makefile->GetSafeDefinition("CMAKE_SYSTEM_NAME"),
           "Android") == 0;

  // Setup default property values.
  if (this->GetType() != cmState::INTERFACE_LIBRARY
      && this->GetType() != cmState::UTILITY)
    {
    this->SetPropertyDefault("ANDROID_API", 0);
    this->SetPropertyDefault("ANDROID_API_MIN", 0);
    this->SetPropertyDefault("ANDROID_ARCH", 0);
    this->SetPropertyDefault("ANDROID_STL_TYPE", 0);
    this->SetPropertyDefault("ANDROID_SKIP_ANT_STEP", 0);
    this->SetPropertyDefault("ANDROID_PROCESS_MAX", 0);
    this->SetPropertyDefault("ANDROID_PROGUARD", 0);
    this->SetPropertyDefault("ANDROID_PROGUARD_CONFIG_PATH", 0);
    this->SetPropertyDefault("ANDROID_SECURE_PROPS_PATH", 0);
    this->SetPropertyDefault("ANDROID_NATIVE_LIB_DIRECTORIES", 0);
    this->SetPropertyDefault("ANDROID_NATIVE_LIB_DEPENDENCIES", 0);
    this->SetPropertyDefault("ANDROID_JAVA_SOURCE_DIR", 0);
    this->SetPropertyDefault("ANDROID_JAR_DIRECTORIES", 0);
    this->SetPropertyDefault("ANDROID_JAR_DEPENDENCIES", 0);
    this->SetPropertyDefault("ANDROID_ASSETS_DIRECTORIES", 0);
    this->SetPropertyDefault("ANDROID_ANT_ADDITIONAL_OPTIONS", 0);
    this->SetPropertyDefault("INSTALL_NAME_DIR", 0);
    this->SetPropertyDefault("INSTALL_RPATH", "");
    this->SetPropertyDefault("INSTALL_RPATH_USE_LINK_PATH", "OFF");
    this->SetPropertyDefault("SKIP_BUILD_RPATH", "OFF");
    this->SetPropertyDefault("BUILD_WITH_INSTALL_RPATH", "OFF");
    this->SetPropertyDefault("ARCHIVE_OUTPUT_DIRECTORY", 0);
    this->SetPropertyDefault("LIBRARY_OUTPUT_DIRECTORY", 0);
    this->SetPropertyDefault("RUNTIME_OUTPUT_DIRECTORY", 0);
    this->SetPropertyDefault("PDB_OUTPUT_DIRECTORY", 0);
    this->SetPropertyDefault("COMPILE_PDB_OUTPUT_DIRECTORY", 0);
    this->SetPropertyDefault("Fortran_FORMAT", 0);
    this->SetPropertyDefault("Fortran_MODULE_DIRECTORY", 0);
    this->SetPropertyDefault("GNUtoMS", 0);
    this->SetPropertyDefault("OSX_ARCHITECTURES", 0);
    this->SetPropertyDefault("IOS_INSTALL_COMBINED", 0);
    this->SetPropertyDefault("AUTOMOC", 0);
    this->SetPropertyDefault("AUTOUIC", 0);
    this->SetPropertyDefault("AUTORCC", 0);
    this->SetPropertyDefault("AUTOMOC_MOC_OPTIONS", 0);
    this->SetPropertyDefault("AUTOUIC_OPTIONS", 0);
    this->SetPropertyDefault("AUTORCC_OPTIONS", 0);
    this->SetPropertyDefault("LINK_DEPENDS_NO_SHARED", 0);
    this->SetPropertyDefault("LINK_INTERFACE_LIBRARIES", 0);
    this->SetPropertyDefault("WIN32_EXECUTABLE", 0);
    this->SetPropertyDefault("MACOSX_BUNDLE", 0);
    this->SetPropertyDefault("MACOSX_RPATH", 0);
    this->SetPropertyDefault("NO_SYSTEM_FROM_IMPORTED", 0);
    this->SetPropertyDefault("C_COMPILER_LAUNCHER", 0);
    this->SetPropertyDefault("C_INCLUDE_WHAT_YOU_USE", 0);
    this->SetPropertyDefault("C_STANDARD", 0);
    this->SetPropertyDefault("C_STANDARD_REQUIRED", 0);
    this->SetPropertyDefault("C_EXTENSIONS", 0);
    this->SetPropertyDefault("CXX_COMPILER_LAUNCHER", 0);
    this->SetPropertyDefault("CXX_INCLUDE_WHAT_YOU_USE", 0);
    this->SetPropertyDefault("CXX_STANDARD", 0);
    this->SetPropertyDefault("CXX_STANDARD_REQUIRED", 0);
    this->SetPropertyDefault("CXX_EXTENSIONS", 0);
    this->SetPropertyDefault("LINK_SEARCH_START_STATIC", 0);
    this->SetPropertyDefault("LINK_SEARCH_END_STATIC", 0);
    }

  // Collect the set of configuration types.
  std::vector<std::string> configNames;
  mf->GetConfigurations(configNames);

  // Setup per-configuration property default values.
  if (this->GetType() != cmState::UTILITY)
    {
    const char* configProps[] = {
      "ARCHIVE_OUTPUT_DIRECTORY_",
      "LIBRARY_OUTPUT_DIRECTORY_",
      "RUNTIME_OUTPUT_DIRECTORY_",
      "PDB_OUTPUT_DIRECTORY_",
      "COMPILE_PDB_OUTPUT_DIRECTORY_",
      "MAP_IMPORTED_CONFIG_",
      0};
    for(std::vector<std::string>::iterator ci = configNames.begin();
        ci != configNames.end(); ++ci)
      {
      std::string configUpper = cmSystemTools::UpperCase(*ci);
      for(const char** p = configProps; *p; ++p)
        {
        if (this->TargetTypeValue == cmState::INTERFACE_LIBRARY
            && strcmp(*p, "MAP_IMPORTED_CONFIG_") != 0)
          {
          continue;
          }
        std::string property = *p;
        property += configUpper;
        this->SetPropertyDefault(property, 0);
        }

      // Initialize per-configuration name postfix property from the
      // variable only for non-executable targets.  This preserves
      // compatibility with previous CMake versions in which executables
      // did not support this variable.  Projects may still specify the
      // property directly.
      if(this->TargetTypeValue != cmState::EXECUTABLE
          && this->TargetTypeValue != cmState::INTERFACE_LIBRARY)
        {
        std::string property = cmSystemTools::UpperCase(*ci);
        property += "_POSTFIX";
        this->SetPropertyDefault(property, 0);
        }
      }
    }

  // Save the backtrace of target construction.
  this->Backtrace = this->Makefile->GetBacktrace();

  if (!this->IsImported())
    {
    // Initialize the INCLUDE_DIRECTORIES property based on the current value
    // of the same directory property:
    const cmStringRange parentIncludes =
        this->Makefile->GetIncludeDirectoriesEntries();
    const cmBacktraceRange parentIncludesBts =
        this->Makefile->GetIncludeDirectoriesBacktraces();

    this->Internal->IncludeDirectoriesEntries.insert(
          this->Internal->IncludeDirectoriesEntries.end(),
          parentIncludes.begin(), parentIncludes.end());
    this->Internal->IncludeDirectoriesBacktraces.insert(
          this->Internal->IncludeDirectoriesBacktraces.end(),
          parentIncludesBts.begin(), parentIncludesBts.end());

    const std::set<std::string> parentSystemIncludes =
                                this->Makefile->GetSystemIncludeDirectories();

    this->SystemIncludeDirectories.insert(parentSystemIncludes.begin(),
                                          parentSystemIncludes.end());

    const cmStringRange parentOptions =
                                this->Makefile->GetCompileOptionsEntries();
    const cmBacktraceRange parentOptionsBts =
                                this->Makefile->GetCompileOptionsBacktraces();

    this->Internal->CompileOptionsEntries.insert(
          this->Internal->CompileOptionsEntries.end(),
          parentOptions.begin(), parentOptions.end());
    this->Internal->CompileOptionsBacktraces.insert(
          this->Internal->CompileOptionsBacktraces.end(),
          parentOptionsBts.begin(), parentOptionsBts.end());
    }

  if (this->GetType() != cmState::INTERFACE_LIBRARY
      && this->GetType() != cmState::UTILITY)
    {
    this->SetPropertyDefault("C_VISIBILITY_PRESET", 0);
    this->SetPropertyDefault("CXX_VISIBILITY_PRESET", 0);
    this->SetPropertyDefault("VISIBILITY_INLINES_HIDDEN", 0);
    }

  if(this->TargetTypeValue == cmState::EXECUTABLE)
    {
    this->SetPropertyDefault("ANDROID_GUI", 0);
    this->SetPropertyDefault("CROSSCOMPILING_EMULATOR", 0);
    this->SetPropertyDefault("ENABLE_EXPORTS", 0);
    }
  if(this->TargetTypeValue == cmState::SHARED_LIBRARY
      || this->TargetTypeValue == cmState::MODULE_LIBRARY)
    {
    this->SetProperty("POSITION_INDEPENDENT_CODE", "True");
    }
  if(this->TargetTypeValue == cmState::SHARED_LIBRARY)
    {
    this->SetPropertyDefault("WINDOWS_EXPORT_ALL_SYMBOLS", 0);
    }

  if (this->GetType() != cmState::INTERFACE_LIBRARY
      && this->GetType() != cmState::UTILITY)
    {
    this->SetPropertyDefault("POSITION_INDEPENDENT_CODE", 0);
    }

  // Record current policies for later use.
  this->Makefile->RecordPolicies(this->PolicyMap);

  if (this->TargetTypeValue == cmState::INTERFACE_LIBRARY)
    {
    // This policy is checked in a few conditions. The properties relevant
    // to the policy are always ignored for cmState::INTERFACE_LIBRARY targets,
    // so ensure that the conditions don't lead to nonsense.
    this->PolicyMap.Set(cmPolicies::CMP0022, cmPolicies::NEW);
    }

  if (this->GetType() != cmState::INTERFACE_LIBRARY
      && this->GetType() != cmState::UTILITY)
    {
    this->SetPropertyDefault("JOB_POOL_COMPILE", 0);
    this->SetPropertyDefault("JOB_POOL_LINK", 0);
    }
}